

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_ArgParsing::test_method(util_ArgParsing *this)

{
  long lVar1;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  allocator<char> *in_stack_fffffffffffffb18;
  allocator<char> *__a;
  char *in_stack_fffffffffffffb20;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_fffffffffffffbe0;
  allocator<char> local_407;
  allocator<char> local_406;
  allocator<char> local_405;
  allocator<char> local_404;
  allocator<char> local_403;
  allocator<char> local_402;
  allocator<char> local_401;
  allocator<char> local_400;
  undefined1 local_3ff [2];
  allocator<char> local_3fd;
  allocator<char> local_3fc;
  allocator<char> local_3fb;
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  allocator<char> local_3f8;
  allocator<char> local_3f7;
  allocator<char> local_3f6;
  allocator<char> local_3f5;
  allocator<char> local_3f4;
  allocator<char> local_3f3;
  allocator<char> local_3f2;
  allocator<char> local_3f1;
  allocator<char> local_3f0;
  allocator<char> local_3ef;
  allocator<char> local_3ee;
  allocator<char> local_3ed;
  allocator<char> local_3ec;
  allocator<char> local_3eb;
  allocator<char> local_3ea;
  allocator<char> local_3e9 [473];
  int64_t in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdff;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3ea);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3eb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3ec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3ed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3ee);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3fa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3fb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3fc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_3fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator((allocator<char> *)(local_3ff + 1));
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3ff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator((allocator<char> *)local_3ff);
  __s = &local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffb18);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_400);
  __a = &local_401;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_402);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_403);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_404);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_405);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_406);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  TestParse(in_stack_fffffffffffffbe0,(bool)in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffad8);
  std::allocator<char>::~allocator(&local_407);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ArgParsing)
{
    // Some of these cases could be ambiguous or surprising to users, and might
    // be worth triggering errors or warnings in the future. But for now basic
    // test coverage is useful to avoid breaking backwards compatibility
    // unintentionally.
    TestParse("", true, 0);
    TestParse(" ", false, 0);
    TestParse("0", false, 0);
    TestParse("0 ", false, 0);
    TestParse(" 0", false, 0);
    TestParse("+0", false, 0);
    TestParse("-0", false, 0);
    TestParse("5", true, 5);
    TestParse("5 ", true, 5);
    TestParse(" 5", true, 5);
    TestParse("+5", true, 5);
    TestParse("-5", true, -5);
    TestParse("0 5", false, 0);
    TestParse("5 0", true, 5);
    TestParse("050", true, 50);
    TestParse("0.", false, 0);
    TestParse("5.", true, 5);
    TestParse("0.0", false, 0);
    TestParse("0.5", false, 0);
    TestParse("5.0", true, 5);
    TestParse("5.5", true, 5);
    TestParse("x", false, 0);
    TestParse("x0", false, 0);
    TestParse("x5", false, 0);
    TestParse("0x", false, 0);
    TestParse("5x", true, 5);
    TestParse("0x5", false, 0);
    TestParse("false", false, 0);
    TestParse("true", false, 0);
    TestParse("yes", false, 0);
    TestParse("no", false, 0);
}